

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gestures.h
# Opt level: O2

void ProcessGestureEvent(GestureEvent event)

{
  float fVar1;
  anon_struct_16_3_87c46a66_for_Pinch aVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  aVar2 = GESTURES.Pinch;
  GESTURES.Touch.pointCount = event.pointCount;
  fVar6 = event.position[0].x;
  fVar8 = event.position[0].y;
  if (event.pointCount < 2) {
    if (event.touchAction == 0) {
      if (GESTURES.current == 8) {
        GESTURES.Touch.upPosition = event.position[0];
      }
      fVar6 = GESTURES.Touch.downPositionA.x - GESTURES.Touch.upPosition.x;
      fVar8 = GESTURES.Touch.downPositionA.y - GESTURES.Touch.upPosition.y;
      fVar6 = SQRT(fVar6 * fVar6 + fVar8 * fVar8);
      GESTURES.Drag.distance = fVar6;
      dVar5 = GetCurrentTime();
      GESTURES.Drag.intensity = fVar6 / (float)(dVar5 - GESTURES.Swipe.timeDuration);
      GESTURES.Swipe.start = false;
      if ((GESTURES.Drag.intensity <= 0.0005) || (GESTURES.Touch.firstId != event.pointerId[0])) {
        GESTURES.Drag.intensity = 0.0;
        GESTURES.Drag.angle = 0.0;
        GESTURES.Drag.distance = 0.0;
        GESTURES.current = 0;
      }
      else {
        fVar6 = Vector2Angle(GESTURES.Touch.downPositionA,GESTURES.Touch.upPosition);
        GESTURES.Drag.angle = 360.0 - fVar6;
        GESTURES.current = 0x10;
        if ((30.0 <= GESTURES.Drag.angle) && (GESTURES.Drag.angle <= 330.0)) {
          if ((GESTURES.Drag.angle <= 30.0) || (120.0 <= GESTURES.Drag.angle)) {
            if ((GESTURES.Drag.angle <= 120.0) || (210.0 <= GESTURES.Drag.angle)) {
              GESTURES.current =
                   (-(uint)(210.0 < GESTURES.Drag.angle && GESTURES.Drag.angle < 300.0) & 1) << 7;
            }
            else {
              GESTURES.current = 0x20;
            }
          }
          else {
            GESTURES.current = 0x40;
          }
        }
      }
      GESTURES.Touch.downDragPosition.x = 0.0;
      GESTURES.Touch.downDragPosition.y = 0.0;
      GESTURES.Touch.pointCount = 0;
    }
    else if (event.touchAction == 2) {
      if (GESTURES.current == 8) {
        GESTURES.Touch.eventTime = GetCurrentTime();
      }
      if (GESTURES.Swipe.start == false) {
        GESTURES.Swipe.timeDuration = GetCurrentTime();
        GESTURES.Swipe.start = true;
      }
      GESTURES.Touch.moveDownPositionA = event.position[0];
      if (GESTURES.current == 4) {
        if (GESTURES.Hold.resetRequired != false) {
          GESTURES.Touch.downPositionA = event.position[0];
        }
        GESTURES.Hold.resetRequired = false;
        fVar6 = GESTURES.Touch.downPositionA.x - fVar6;
        fVar8 = GESTURES.Touch.downPositionA.y - fVar8;
        if (0.015 <= SQRT(fVar6 * fVar6 + fVar8 * fVar8)) {
          GESTURES.Touch.eventTime = GetCurrentTime();
          GESTURES.current = 8;
        }
      }
      GESTURES.Drag.vector.x =
           GESTURES.Touch.moveDownPositionA.x - GESTURES.Touch.downDragPosition.x;
      GESTURES.Drag.vector.y =
           GESTURES.Touch.moveDownPositionA.y - GESTURES.Touch.downDragPosition.y;
    }
    else if (event.touchAction == 1) {
      if (((GESTURES.Touch.tapCounter < 1 || GESTURES.current != 0) ||
          (GESTURES.Touch.tapCounter = GESTURES.Touch.tapCounter + 1, dVar5 = GetCurrentTime(),
          300.0 <= dVar5 - GESTURES.Touch.eventTime)) ||
         (fVar6 = GESTURES.Touch.downPositionA.x - fVar6,
         fVar8 = GESTURES.Touch.downPositionA.y - fVar8, 0.03 <= SQRT(fVar6 * fVar6 + fVar8 * fVar8)
         )) {
        GESTURES.current = 1;
        GESTURES.Touch.tapCounter = GESTURES.current;
      }
      else {
        GESTURES.current = 2;
        GESTURES.Touch.tapCounter = 0;
      }
      GESTURES.Touch.downPositionA = event.position[0];
      GESTURES.Touch.downDragPosition = event.position[0];
      GESTURES.Touch.upPosition = event.position[0];
      GESTURES.Touch.eventTime = GetCurrentTime();
      GESTURES.Touch.firstId = event.pointerId[0];
      GESTURES.Drag.vector.x = 0.0;
      GESTURES.Drag.vector.y = 0.0;
    }
  }
  else if (event.touchAction == 0) {
    GESTURES.Touch.pointCount = 0;
    GESTURES.current = 0;
    GESTURES.Pinch = (anon_struct_16_3_87c46a66_for_Pinch)ZEXT816(0);
  }
  else {
    fVar3 = event.position[1].x;
    fVar1 = event.position[1].y;
    if (event.touchAction == 2) {
      fVar9 = GESTURES.Touch.moveDownPositionB.x;
      fVar10 = GESTURES.Touch.moveDownPositionB.y;
      fVar11 = GESTURES.Touch.moveDownPositionA.x;
      fVar12 = GESTURES.Touch.moveDownPositionA.y;
      fVar4 = fVar11 - fVar9;
      fVar7 = fVar12 - fVar10;
      fVar4 = SQRT(fVar4 * fVar4 + fVar7 * fVar7);
      GESTURES.Pinch.distance = fVar4;
      aVar2 = GESTURES.Pinch;
      GESTURES.Touch.downPositionA = GESTURES.Touch.moveDownPositionA;
      GESTURES.Touch.downPositionB = GESTURES.Touch.moveDownPositionB;
      GESTURES.Touch.moveDownPositionA = event.position[0];
      GESTURES.Touch.moveDownPositionB = event.position[1];
      GESTURES.Pinch.vector.y = fVar1 - fVar8;
      GESTURES.Pinch.vector.x = fVar3 - fVar6;
      GESTURES.Pinch._8_8_ = aVar2._8_8_;
      fVar11 = fVar11 - fVar6;
      fVar12 = fVar12 - fVar8;
      if ((0.005 <= SQRT(fVar11 * fVar11 + fVar12 * fVar12)) ||
         (fVar9 = fVar9 - fVar3, fVar10 = fVar10 - fVar1,
         0.005 <= SQRT(fVar9 * fVar9 + fVar10 * fVar10))) {
        if (fVar4 <= SQRT((fVar6 - fVar3) * (fVar6 - fVar3) + (fVar8 - fVar1) * (fVar8 - fVar1))) {
          GESTURES.current = 0x200;
        }
        else {
          GESTURES.current = 0x100;
        }
      }
      else {
        GESTURES.current = 4;
        GESTURES.Hold.timeDuration = GetCurrentTime();
      }
      fVar6 = Vector2Angle(GESTURES.Touch.moveDownPositionA,GESTURES.Touch.moveDownPositionB);
      GESTURES.Pinch.angle = 360.0 - fVar6;
    }
    else if (event.touchAction == 1) {
      GESTURES.Touch.downPositionA = event.position[0];
      GESTURES.Touch.downPositionB = event.position[1];
      GESTURES.Pinch.vector.y = fVar1 - fVar8;
      GESTURES.Pinch.vector.x = fVar3 - fVar6;
      GESTURES.Pinch._8_8_ = aVar2._8_8_;
      GESTURES.current = 4;
      GESTURES.Hold.timeDuration = GetCurrentTime();
    }
  }
  return;
}

Assistant:

void ProcessGestureEvent(GestureEvent event)
{
    // Reset required variables
    GESTURES.Touch.pointCount = event.pointCount;      // Required on UpdateGestures()

    if (GESTURES.Touch.pointCount < 2)
    {
        if (event.touchAction == TOUCH_DOWN)
        {
            GESTURES.Touch.tapCounter++;    // Tap counter

            // Detect GESTURE_DOUBLE_TAP
            if ((GESTURES.current == GESTURE_NONE) && (GESTURES.Touch.tapCounter >= 2) && ((GetCurrentTime() - GESTURES.Touch.eventTime) < TAP_TIMEOUT) && (Vector2Distance(GESTURES.Touch.downPositionA, event.position[0]) < DOUBLETAP_RANGE))
            {
                GESTURES.current = GESTURE_DOUBLETAP;
                GESTURES.Touch.tapCounter = 0;
            }
            else    // Detect GESTURE_TAP
            {
                GESTURES.Touch.tapCounter = 1;
                GESTURES.current = GESTURE_TAP;
            }

            GESTURES.Touch.downPositionA = event.position[0];
            GESTURES.Touch.downDragPosition = event.position[0];

            GESTURES.Touch.upPosition = GESTURES.Touch.downPositionA;
            GESTURES.Touch.eventTime = GetCurrentTime();

            GESTURES.Touch.firstId = event.pointerId[0];

            GESTURES.Drag.vector = (Vector2){ 0.0f, 0.0f };
        }
        else if (event.touchAction == TOUCH_UP)
        {
            if (GESTURES.current == GESTURE_DRAG) GESTURES.Touch.upPosition = event.position[0];

            // NOTE: GESTURES.Drag.intensity dependend on the resolution of the screen
            GESTURES.Drag.distance = Vector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.upPosition);
            GESTURES.Drag.intensity = GESTURES.Drag.distance/(float)((GetCurrentTime() - GESTURES.Swipe.timeDuration));

            GESTURES.Swipe.start = false;

            // Detect GESTURE_SWIPE
            if ((GESTURES.Drag.intensity > FORCE_TO_SWIPE) && (GESTURES.Touch.firstId == event.pointerId[0]))
            {
                // NOTE: Angle should be inverted in Y
                GESTURES.Drag.angle = 360.0f - Vector2Angle(GESTURES.Touch.downPositionA, GESTURES.Touch.upPosition);

                if ((GESTURES.Drag.angle < 30) || (GESTURES.Drag.angle > 330)) GESTURES.current = GESTURE_SWIPE_RIGHT;        // Right
                else if ((GESTURES.Drag.angle > 30) && (GESTURES.Drag.angle < 120)) GESTURES.current = GESTURE_SWIPE_UP;      // Up
                else if ((GESTURES.Drag.angle > 120) && (GESTURES.Drag.angle < 210)) GESTURES.current = GESTURE_SWIPE_LEFT;   // Left
                else if ((GESTURES.Drag.angle > 210) && (GESTURES.Drag.angle < 300)) GESTURES.current = GESTURE_SWIPE_DOWN;   // Down
                else GESTURES.current = GESTURE_NONE;
            }
            else
            {
                GESTURES.Drag.distance = 0.0f;
                GESTURES.Drag.intensity = 0.0f;
                GESTURES.Drag.angle = 0.0f;

                GESTURES.current = GESTURE_NONE;
            }

            GESTURES.Touch.downDragPosition = (Vector2){ 0.0f, 0.0f };
            GESTURES.Touch.pointCount = 0;
        }
        else if (event.touchAction == TOUCH_MOVE)
        {
            if (GESTURES.current == GESTURE_DRAG) GESTURES.Touch.eventTime = GetCurrentTime();

            if (!GESTURES.Swipe.start)
            {
                GESTURES.Swipe.timeDuration = GetCurrentTime();
                GESTURES.Swipe.start = true;
            }

            GESTURES.Touch.moveDownPositionA = event.position[0];

            if (GESTURES.current == GESTURE_HOLD)
            {
                if (GESTURES.Hold.resetRequired) GESTURES.Touch.downPositionA = event.position[0];

                GESTURES.Hold.resetRequired = false;

                // Detect GESTURE_DRAG
                if (Vector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.moveDownPositionA) >= MINIMUM_DRAG)
                {
                    GESTURES.Touch.eventTime = GetCurrentTime();
                    GESTURES.current = GESTURE_DRAG;
                }
            }

            GESTURES.Drag.vector.x = GESTURES.Touch.moveDownPositionA.x - GESTURES.Touch.downDragPosition.x;
            GESTURES.Drag.vector.y = GESTURES.Touch.moveDownPositionA.y - GESTURES.Touch.downDragPosition.y;
        }
    }
    else    // Two touch points
    {
        if (event.touchAction == TOUCH_DOWN)
        {
            GESTURES.Touch.downPositionA = event.position[0];
            GESTURES.Touch.downPositionB = event.position[1];

            //GESTURES.Pinch.distance = Vector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.downPositionB);

            GESTURES.Pinch.vector.x = GESTURES.Touch.downPositionB.x - GESTURES.Touch.downPositionA.x;
            GESTURES.Pinch.vector.y = GESTURES.Touch.downPositionB.y - GESTURES.Touch.downPositionA.y;

            GESTURES.current = GESTURE_HOLD;
            GESTURES.Hold.timeDuration = GetCurrentTime();
        }
        else if (event.touchAction == TOUCH_MOVE)
        {
            GESTURES.Pinch.distance = Vector2Distance(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB);

            GESTURES.Touch.downPositionA = GESTURES.Touch.moveDownPositionA;
            GESTURES.Touch.downPositionB = GESTURES.Touch.moveDownPositionB;

            GESTURES.Touch.moveDownPositionA = event.position[0];
            GESTURES.Touch.moveDownPositionB = event.position[1];

            GESTURES.Pinch.vector.x = GESTURES.Touch.moveDownPositionB.x - GESTURES.Touch.moveDownPositionA.x;
            GESTURES.Pinch.vector.y = GESTURES.Touch.moveDownPositionB.y - GESTURES.Touch.moveDownPositionA.y;

            if ((Vector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.moveDownPositionA) >= MINIMUM_PINCH) || (Vector2Distance(GESTURES.Touch.downPositionB, GESTURES.Touch.moveDownPositionB) >= MINIMUM_PINCH))
            {
                if ((Vector2Distance(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB) - GESTURES.Pinch.distance) < 0) GESTURES.current = GESTURE_PINCH_IN;
                else GESTURES.current = GESTURE_PINCH_OUT;
            }
            else
            {
                GESTURES.current = GESTURE_HOLD;
                GESTURES.Hold.timeDuration = GetCurrentTime();
            }

            // NOTE: Angle should be inverted in Y
            GESTURES.Pinch.angle = 360.0f - Vector2Angle(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB);
        }
        else if (event.touchAction == TOUCH_UP)
        {
            GESTURES.Pinch.distance = 0.0f;
            GESTURES.Pinch.angle = 0.0f;
            GESTURES.Pinch.vector = (Vector2){ 0.0f, 0.0f };
            GESTURES.Touch.pointCount = 0;

            GESTURES.current = GESTURE_NONE;
        }
    }
}